

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TapeUEF.cpp
# Opt level: O1

void __thiscall Storage::Tape::UEF::queue_defined_data(UEF *this,uint32_t length)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  bool bVar5;
  uint8_t result_2;
  uint8_t result_3;
  uint8_t result;
  uint8_t result_1;
  byte local_3c;
  byte local_3b;
  byte local_3a;
  char local_39;
  uint local_38;
  uint local_34;
  
  if (2 < length) {
    gzread(this->file_,&local_3a,1);
    local_34 = (uint)local_3a;
    gzread(this->file_,&local_39,1);
    gzread(this->file_,&local_3c,1);
    if (length != 3) {
      local_38 = (uint)local_3c;
      iVar2 = length - 4;
      do {
        gzread(this->file_,&local_3b,1);
        bVar1 = local_3b;
        queue_bit(this,0);
        bVar4 = bVar1;
        uVar3 = local_34;
        if ((char)local_34 != '\0') {
          do {
            queue_bit(this,(uint)(bVar4 & 1));
            uVar3 = uVar3 - 1;
            bVar4 = bVar4 >> 1;
          } while (uVar3 != 0);
        }
        bVar1 = bVar1 >> 4 ^ bVar1;
        bVar1 = bVar1 >> 2 ^ bVar1;
        bVar1 = bVar1 >> 1 ^ bVar1;
        if (local_39 == 'O') {
          bVar1 = ~bVar1;
LAB_004553af:
          queue_bit(this,(uint)(bVar1 & 1));
        }
        else if (local_39 == 'E') goto LAB_004553af;
        uVar3 = local_38;
        if ((char)local_38 != '\0') {
          do {
            queue_bit(this,1);
            uVar3 = uVar3 - 1;
          } while (uVar3 != 0);
        }
        bVar5 = iVar2 != 0;
        iVar2 = iVar2 + -1;
      } while (bVar5);
    }
  }
  return;
}

Assistant:

void UEF::queue_defined_data(uint32_t length) {
	if(length < 3) return;

	const int bits_per_packet = gzget8(file_);
	const char parity_type = char(gzget8(file_));
	int number_of_stop_bits = gzget8(file_);

	const bool has_extra_stop_wave = (number_of_stop_bits < 0);
	number_of_stop_bits = abs(number_of_stop_bits);

	length -= 3;
	while(length--) {
		uint8_t byte = gzget8(file_);

		uint8_t parity_value = byte;
		parity_value ^= (parity_value >> 4);
		parity_value ^= (parity_value >> 2);
		parity_value ^= (parity_value >> 1);

		queue_bit(0);
		int c = bits_per_packet;
		while(c--) {
			queue_bit(byte&1);
			byte >>= 1;
		}

		switch(parity_type) {
			default: break;
			case 'E': queue_bit(parity_value&1);		break;
			case 'O': queue_bit((parity_value&1) ^ 1);	break;
		}

		int stop_bits = number_of_stop_bits;
		while(stop_bits--) queue_bit(1);
		if(has_extra_stop_wave) {
			Time duration;
			duration.length = 1;
			duration.clock_rate = time_base_ * 4;
			emplace_back(Pulse::Low, duration);
			emplace_back(Pulse::High, duration);
		}
	}
}